

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_ObjectRenderingAttributes::AddMappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,int mapping_channel_id,
          ON_UUID *mapping_id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_MappingRef *pOVar3;
  ON_MappingChannel *pOVar4;
  ON_MappingChannel *mc;
  ON_MappingRef *mr;
  ON_UUID *mapping_id_local;
  int mapping_channel_id_local;
  ON_UUID *plugin_id_local;
  ON_ObjectRenderingAttributes *this_local;
  
  pOVar3 = MappingRef(this,plugin_id);
  if (pOVar3 == (ON_MappingRef *)0x0) {
    pOVar3 = ON_ClassArray<ON_MappingRef>::AppendNew(&this->m_mappings);
    uVar1 = plugin_id->Data2;
    uVar2 = plugin_id->Data3;
    (pOVar3->m_plugin_id).Data1 = plugin_id->Data1;
    (pOVar3->m_plugin_id).Data2 = uVar1;
    (pOVar3->m_plugin_id).Data3 = uVar2;
    *(undefined8 *)(pOVar3->m_plugin_id).Data4 = *(undefined8 *)plugin_id->Data4;
    pOVar4 = ON_SimpleArray<ON_MappingChannel>::AppendNew(&pOVar3->m_mapping_channels);
    pOVar4->m_mapping_channel_id = mapping_channel_id;
    uVar1 = mapping_id->Data2;
    uVar2 = mapping_id->Data3;
    (pOVar4->m_mapping_id).Data1 = mapping_id->Data1;
    (pOVar4->m_mapping_id).Data2 = uVar1;
    (pOVar4->m_mapping_id).Data3 = uVar2;
    *(undefined8 *)(pOVar4->m_mapping_id).Data4 = *(undefined8 *)mapping_id->Data4;
    pOVar4->m_mapping_index = -1;
    memcpy(&pOVar4->m_object_xform,&ON_Xform::IdentityTransformation,0x80);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = ON_MappingRef::AddMappingChannel(pOVar3,mapping_channel_id,mapping_id);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjectRenderingAttributes::AddMappingChannel(
        const ON_UUID& plugin_id,
        int mapping_channel_id,
        const ON_UUID& mapping_id
        )
{
  ON_MappingRef* mr = const_cast<ON_MappingRef*>(MappingRef(plugin_id));
  if ( !mr )
  {
    mr = &m_mappings.AppendNew();
    mr->m_plugin_id = plugin_id;
    ON_MappingChannel& mc = mr->m_mapping_channels.AppendNew();
    mc.m_mapping_channel_id = mapping_channel_id;
    mc.m_mapping_id = mapping_id;
    mc.m_mapping_index = -1; // 27th October 2011 John Croudy - constructor is not called by AppendNew().
    mc.m_object_xform = ON_Xform::IdentityTransformation;
    return true;
  }

  return mr->AddMappingChannel(mapping_channel_id,mapping_id);
}